

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O3

PyObject * libxml_xmlTextReaderGetErrorHandler(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  undefined8 uVar3;
  long *plVar4;
  PyObject *pyobj_reader;
  void *arg;
  xmlTextReaderErrorFunc f;
  undefined *local_28;
  undefined8 *local_20;
  code *local_18;
  
  pPVar2 = (PyObject *)0x0;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlTextReaderSetErrorHandler",&local_28);
  if (iVar1 != 0) {
    if (local_28 == &_Py_NoneStruct) {
      uVar3 = 0;
    }
    else {
      uVar3 = *(undefined8 *)(local_28 + 0x10);
    }
    xmlTextReaderGetErrorHandler(uVar3,&local_18,&local_20);
    pPVar2 = (PyObject *)PyTuple_New(2);
    if (local_18 == libxml_xmlTextReaderErrorCallback) {
      PyTuple_SetItem(pPVar2,0,*local_20);
      plVar4 = (long *)*local_20;
      if (plVar4 != (long *)0x0) {
        *plVar4 = *plVar4 + 1;
      }
      PyTuple_SetItem(pPVar2,1,local_20[1]);
      plVar4 = (long *)local_20[1];
      if (plVar4 == (long *)0x0) {
        return pPVar2;
      }
    }
    else {
      plVar4 = (long *)&_Py_NoneStruct;
      PyTuple_SetItem(pPVar2,0,&_Py_NoneStruct);
      __Py_NoneStruct = __Py_NoneStruct + 1;
      PyTuple_SetItem(pPVar2,1,&_Py_NoneStruct);
    }
    *plVar4 = *plVar4 + 1;
  }
  return pPVar2;
}

Assistant:

static PyObject *
libxml_xmlTextReaderGetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args)
{
    xmlTextReaderPtr reader;
    xmlTextReaderPyCtxtPtr pyCtxt;
    xmlTextReaderErrorFunc f;
    void *arg;
    PyObject *pyobj_reader;
    PyObject *py_retval;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlTextReaderSetErrorHandler", &pyobj_reader))
        return(NULL);
    reader = (xmlTextReaderPtr) PyxmlTextReader_Get(pyobj_reader);
    xmlTextReaderGetErrorHandler(reader,&f,&arg);
    py_retval = PyTuple_New(2);
    if (f == (xmlTextReaderErrorFunc)libxml_xmlTextReaderErrorCallback) {
	/* ok, it's our error handler! */
	pyCtxt = (xmlTextReaderPyCtxtPtr)arg;
	PyTuple_SetItem(py_retval, 0, pyCtxt->f);
	Py_XINCREF(pyCtxt->f);
	PyTuple_SetItem(py_retval, 1, pyCtxt->arg);
	Py_XINCREF(pyCtxt->arg);
    }
    else
    {
	/* f is null or it's not our error handler */
	PyTuple_SetItem(py_retval, 0, Py_None);
	Py_XINCREF(Py_None);
	PyTuple_SetItem(py_retval, 1, Py_None);
	Py_XINCREF(Py_None);
    }
    return(py_retval);
}